

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void * compact_upto_thread(void *args)

{
  fdb_status fVar1;
  int iVar2;
  bool bVar3;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_open(&dbfile,"e2edb_main",(fdb_config *)args);
  iVar2 = 10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    sleep(1);
    fVar1 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x219);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x219,"void *compact_upto_thread(void *)");
    }
    if (num_markers == 0) break;
    fVar1 = fdb_compact_upto(dbfile,(char *)0x0,markers->marker);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x21f);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x21f,"void *compact_upto_thread(void *)");
    }
    fdb_free_snap_markers(markers,num_markers);
  }
  fdb_close(dbfile);
  return (void *)0x0;
}

Assistant:

void *compact_upto_thread(void *args) {
    TEST_INIT();

    int i;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_status status;

    fdb_config *fconfig = (fdb_config *)args;
    fdb_file_handle *dbfile;
    fdb_open(&dbfile, E2EDB_MAIN, fconfig);
    for (i = 0; i < 10; ++i) {
        sleep(1);
        status = fdb_get_all_snap_markers(dbfile, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (num_markers == 0) {
            // No need of compaction as file is empty
            break;
        }
        status = fdb_compact_upto(dbfile, NULL, markers[0].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_free_snap_markers(markers, num_markers);
    }
    fdb_close(dbfile);
    return NULL;
}